

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser.hpp
# Opt level: O1

vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
* __thiscall
bioparser::FastaParser<biosoup::Sequence>::Parse
          (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           *__return_storage_ptr__,FastaParser<biosoup::Sequence> *this,uint64_t bytes,
          bool shorten_names)

{
  uint32_t *puVar1;
  char cVar2;
  pointer pcVar3;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *pvVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  anon_class_40_5_f07f430f create_T;
  bool local_79;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *local_78;
  uint32_t local_6c;
  ulong local_68;
  uint64_t local_60;
  anon_class_40_5_f07f430f local_58;
  
  local_58.shorten_names = &local_79;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.parsed_bytes = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_58.data_ptr = &local_6c;
  local_6c = 0;
  bVar10 = true;
  bVar9 = false;
  local_79 = shorten_names;
  local_78 = __return_storage_ptr__;
  local_58.this = this;
  local_58.dst = __return_storage_ptr__;
  do {
    uVar6 = (this->super_Parser<biosoup::Sequence>).buffer_ptr_;
    uVar8 = (ulong)uVar6;
    uVar11 = uVar8;
    if (uVar6 < (this->super_Parser<biosoup::Sequence>).buffer_bytes_) {
      do {
        cVar2 = (this->super_Parser<biosoup::Sequence>).buffer_.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar11];
        if (cVar2 == '\n') {
          Parser<biosoup::Sequence>::Store
                    (&this->super_Parser<biosoup::Sequence>,
                     (ulong)((int)uVar8 - (this->super_Parser<biosoup::Sequence>).buffer_ptr_),
                     (bool)~bVar10);
          bVar12 = true;
          if (bVar10) {
            local_6c = (this->super_Parser<biosoup::Sequence>).storage_ptr_;
            bVar10 = false;
          }
        }
        else {
          bVar12 = true;
          if ((cVar2 == '>') && (bVar10 == false)) {
            Parse::anon_class_40_5_f07f430f::operator()(&local_58);
            bVar12 = local_60 < bytes;
            bVar9 = (bool)(bVar9 | !bVar12);
            bVar10 = true;
          }
        }
        if (!bVar12) {
          iVar5 = 1;
          goto LAB_00106040;
        }
        uVar11 = uVar11 + 1;
        uVar6 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar6;
      } while (uVar11 < (this->super_Parser<biosoup::Sequence>).buffer_bytes_);
    }
    puVar1 = &(this->super_Parser<biosoup::Sequence>).buffer_ptr_;
    uVar7 = uVar6 - *puVar1;
    if (*puVar1 <= uVar6 && uVar7 != 0) {
      Parser<biosoup::Sequence>::Store
                (&this->super_Parser<biosoup::Sequence>,(ulong)uVar7,(bool)~bVar10);
    }
    iVar5 = 3;
    if ((local_68 & 1) == 0) {
      (this->super_Parser<biosoup::Sequence>).buffer_ptr_ = 0;
      pcVar3 = (this->super_Parser<biosoup::Sequence>).buffer_.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = gzread((this->super_Parser<biosoup::Sequence>).file_._M_t.
                     super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
                     super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
                     super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,pcVar3,
                     *(int *)&(this->super_Parser<biosoup::Sequence>).buffer_.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (int)pcVar3);
      (this->super_Parser<biosoup::Sequence>).buffer_bytes_ = uVar6;
      local_68 = (ulong)CONCAT31((int3)(uVar6 >> 8),
                                 (ulong)uVar6 <
                                 (ulong)((long)(this->super_Parser<biosoup::Sequence>).buffer_.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->super_Parser<biosoup::Sequence>).buffer_.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
      iVar5 = 0;
    }
LAB_00106040:
    pvVar4 = local_78;
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        local_78 = pvVar4;
        if ((this->super_Parser<biosoup::Sequence>).storage_ptr_ != 0) {
          Parse::anon_class_40_5_f07f430f::operator()(&local_58);
        }
      }
      else {
        local_78 = pvVar4;
        if (!bVar9) {
          std::
          vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
          ::~vector(local_78);
          local_78 = pvVar4;
        }
      }
      return local_78;
    }
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = this->storage_ptr() - data_ptr;

      if (name_len == 0 || this->storage()[0] != '>' || data_len == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            data_ptr = this->storage_ptr();
            is_name = false;
          }
        } else if (!is_name && c == '>') {
          is_name = true;
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }